

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall
chaiscript::exception::name_conflict_error::~name_conflict_error(name_conflict_error *this)

{
  ~name_conflict_error(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~name_conflict_error() noexcept override = default;